

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HeapInfo.cpp
# Opt level: O2

void Memory::HeapInfo::ValidPointersMap<MediumAllocationBlockAttributes>::GenerateValidPointersMap
               (ValidPointersMapTable *validTable,InvalidBitsTable *invalidTable,
               BlockInfoMapTable *blockInfoTable)

{
  BlockInfoMapRow *paBVar1;
  short *psVar2;
  ushort uVar3;
  BlockInfo *pBVar4;
  ushort uVar5;
  ulong uVar6;
  uint uVar7;
  ulong uVar8;
  long lVar9;
  ulong uVar10;
  uint uVar11;
  ushort uVar12;
  ulong uVar13;
  BVIndex i;
  ValidPointersMapTable *paauVar14;
  ushort *puVar15;
  uint local_58;
  long local_50;
  long local_48;
  long local_38;
  
  if (validTable != (ValidPointersMapTable *)0x0) {
    memset(validTable,0xff,0x3a000);
  }
  local_38 = 0x40;
  local_50 = 0x80;
  local_48 = 0x400;
  lVar9 = 0;
  while (lVar9 != 0x1d) {
    puVar15 = (*validTable)[0] + 0x800;
    if (validTable == (ValidPointersMapTable *)0x0) {
      puVar15 = (ushort *)0x0;
    }
    memset(*invalidTable + lVar9,0xff,0x100);
    uVar8 = (lVar9 + 1) * 0x100 + 0x300;
    uVar5 = 0x8000 / (ushort)uVar8;
    i = 0;
    paBVar1 = *blockInfoTable + lVar9;
    ((BlockInfo *)((long)paBVar1 + 0))->lastObjectIndexOnPage = 0;
    ((BlockInfo *)((long)paBVar1 + 0))->pageObjectCount = 0;
    ((BlockInfo *)((long)paBVar1 + 4))->lastObjectIndexOnPage = 0;
    ((BlockInfo *)((long)paBVar1 + 4))->pageObjectCount = 0;
    ((BlockInfo *)((long)paBVar1 + 8))->lastObjectIndexOnPage = 0;
    ((BlockInfo *)((long)paBVar1 + 8))->pageObjectCount = 0;
    ((BlockInfo *)((long)paBVar1 + 0xc))->lastObjectIndexOnPage = 0;
    ((BlockInfo *)((long)paBVar1 + 0xc))->pageObjectCount = 0;
    pBVar4 = (*blockInfoTable)[lVar9];
    pBVar4[4].lastObjectIndexOnPage = 0;
    pBVar4[4].pageObjectCount = 0;
    pBVar4[5].lastObjectIndexOnPage = 0;
    pBVar4[5].pageObjectCount = 0;
    pBVar4[6].lastObjectIndexOnPage = 0;
    pBVar4[6].pageObjectCount = 0;
    pBVar4[7].lastObjectIndexOnPage = 0;
    pBVar4[7].pageObjectCount = 0;
    uVar10 = 0;
    paauVar14 = validTable;
    for (uVar13 = 0; uVar13 < uVar5; uVar13 = uVar13 + 1) {
      uVar12 = (ushort)uVar13;
      if (validTable != (ValidPointersMapTable *)0x0) {
        (*paauVar14)[0][0] = uVar12;
      }
      uVar6 = (ulong)((uint)(uVar10 >> 10) & 0x3fffc);
      psVar2 = (short *)((long)&(*blockInfoTable)[lVar9][0].pageObjectCount + uVar6);
      *psVar2 = *psVar2 + 1;
      uVar3 = *(ushort *)((long)&(*blockInfoTable)[lVar9][0].lastObjectIndexOnPage + uVar6);
      if (uVar12 <= uVar3) {
        uVar12 = uVar3;
      }
      *(ushort *)((long)&(*blockInfoTable)[lVar9][0].lastObjectIndexOnPage + uVar6) = uVar12;
      BVStatic<2048UL>::Clear(*invalidTable + lVar9,i);
      paauVar14 = (ValidPointersMapTable *)((long)(*paauVar14)[0] + local_50);
      uVar10 = uVar10 + local_48;
      i = i + (int)local_38;
    }
    if (puVar15 == (ushort *)0x0) {
      validTable = (ValidPointersMapTable *)0x0;
    }
    else {
      uVar10 = 0;
      uVar7 = 0;
      while (local_58 = (uint)uVar5, uVar7 < local_58) {
        uVar11 = (uVar7 + 1) * (int)(uVar8 >> 4);
        if (0x7ff < uVar11) {
          uVar11 = 0x800;
        }
        for (uVar13 = uVar10; uVar13 < uVar11; uVar13 = uVar13 + 1) {
          puVar15[uVar13] = (ushort)uVar7;
        }
        uVar10 = uVar10 + local_38;
        uVar7 = uVar7 + 1;
      }
      validTable = (ValidPointersMapTable *)(puVar15 + 0x800);
    }
    local_38 = local_38 + 0x10;
    local_50 = local_50 + 0x20;
    local_48 = local_48 + 0x100;
    lVar9 = lVar9 + 1;
  }
  return;
}

Assistant:

void HeapInfo::ValidPointersMap<TBlockAttributes>::GenerateValidPointersMap(ValidPointersMapTable * validTable, InvalidBitsTable& invalidTable, BlockInfoMapTable& blockInfoTable)
{
    // Create the valid pointer map to be shared by the buckets.
    // Also create the invalid objects bit vector.
    ushort * buffer = &((*validTable)[0][0]);
    if (buffer)
    {
        memset(buffer, -1, sizeof(ushort) * 2 * TBlockAttributes::MaxSmallObjectCount * TBlockAttributes::BucketCount);
    }

    for (uint i = 0; i < TBlockAttributes::BucketCount; i++)
    {
        // Non-interior first
        ushort * validPointers = buffer;
        if (buffer)
        {            
            buffer += TBlockAttributes::MaxSmallObjectCount;
        }

        typename SmallHeapBlockT<TBlockAttributes>::SmallHeapBlockBitVector * invalidBitVector = &invalidTable[i];
        invalidBitVector->SetAll();

        uint bucketSize;

        if (TBlockAttributes::IsSmallBlock)
        {
            bucketSize = TBlockAttributes::MinObjectSize + HeapConstants::ObjectGranularity * i;
        }
        else
        {
            bucketSize = TBlockAttributes::MinObjectSize + HeapConstants::MediumObjectGranularity * (i + 1);
        }

        uint stride = bucketSize / HeapConstants::ObjectGranularity;
        uint maxObjectCountForBucket = ((TBlockAttributes::PageCount * AutoSystemInfo::PageSize) / bucketSize);

        BlockInfoMapRow* blockInfoRow = &blockInfoTable[i];

        memset(blockInfoRow, 0, sizeof(BlockInfoMapRow));

        for (ushort j = 0; j < maxObjectCountForBucket; j++)
        {
            if (validPointers)
            {
                validPointers[j * stride] = j;
            }

            uintptr_t objectAddress = j * bucketSize;
            Assert(objectAddress / AutoSystemInfo::PageSize < USHRT_MAX);
            ushort pageIndex = (ushort)(objectAddress / AutoSystemInfo::PageSize);

            (*blockInfoRow)[pageIndex].pageObjectCount++;
            (*blockInfoRow)[pageIndex].lastObjectIndexOnPage = max(j, (*blockInfoRow)[pageIndex].lastObjectIndexOnPage);

            invalidBitVector->Clear(j * stride);
        }

        if (buffer)
        {
            // interior pointer
            ushort * validInteriorPointers = buffer;
            buffer += TBlockAttributes::MaxSmallObjectCount;
            for (ushort j = 0; j < maxObjectCountForBucket; j++)
            {
                uint start = j * stride;
                uint end = min(start + stride, TBlockAttributes::MaxSmallObjectCount);
                for (uint k = start; k < end; k++)
                {
                    validInteriorPointers[k] = j;
                }
            }
        }
    }
}